

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O1

void write_scan_header(j_compress_ptr cinfo)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  jpeg_marker_writer *pjVar5;
  jpeg_component_info *pjVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined6 uVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  long lVar12;
  short sVar13;
  int iVar14;
  int iVar15;
  int iVar21;
  int iVar22;
  undefined1 auVar16 [16];
  int iVar23;
  short sVar24;
  undefined1 auVar25 [16];
  char ac_in_use [16];
  char dc_in_use [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 uVar19;
  undefined2 uVar20;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  pjVar5 = cinfo->marker;
  if (cinfo->arith_code == 0) {
    if (0 < cinfo->comps_in_scan) {
      lVar12 = 0;
      do {
        pjVar6 = cinfo->cur_comp_info[lVar12];
        if ((cinfo->Ss == 0) && (cinfo->Ah == 0)) {
          emit_dht(cinfo,pjVar6->dc_tbl_no,0);
        }
        if (cinfo->Se != 0) {
          emit_dht(cinfo,pjVar6->ac_tbl_no,1);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < cinfo->comps_in_scan);
    }
  }
  else {
    iVar14 = 0;
    iVar21 = 0;
    iVar22 = 0;
    iVar23 = 0;
    local_48 = (undefined1  [16])0x0;
    local_38 = (undefined1  [16])0x0;
    iVar15 = cinfo->comps_in_scan;
    if (0 < (long)iVar15) {
      iVar1 = cinfo->Ss;
      iVar2 = cinfo->Se;
      lVar12 = 0;
      do {
        pjVar6 = cinfo->cur_comp_info[lVar12];
        if ((iVar1 == 0) && (cinfo->Ah == 0)) {
          local_38[pjVar6->dc_tbl_no] = 1;
        }
        if (iVar2 != 0) {
          local_48[pjVar6->ac_tbl_no] = 1;
        }
        lVar12 = lVar12 + 1;
      } while (iVar15 != lVar12);
    }
    lVar12 = 0;
    do {
      uVar3 = *(undefined4 *)(local_38 + lVar12);
      uVar19 = (undefined1)((uint)uVar3 >> 0x18);
      uVar20 = CONCAT11(uVar19,uVar19);
      uVar19 = (undefined1)((uint)uVar3 >> 0x10);
      uVar7 = CONCAT35(CONCAT21(uVar20,uVar19),CONCAT14(uVar19,uVar3));
      uVar19 = (undefined1)((uint)uVar3 >> 8);
      uVar9 = CONCAT51(CONCAT41((int)((ulong)uVar7 >> 0x20),uVar19),uVar19);
      sVar24 = CONCAT11((char)uVar3,(char)uVar3);
      uVar8 = CONCAT62(uVar9,sVar24);
      auVar27._8_4_ = 0;
      auVar27._0_8_ = uVar8;
      auVar27._12_2_ = uVar20;
      auVar27._14_2_ = uVar20;
      uVar20 = (undefined2)((ulong)uVar7 >> 0x20);
      auVar26._12_4_ = auVar27._12_4_;
      auVar26._8_2_ = 0;
      auVar26._0_8_ = uVar8;
      auVar26._10_2_ = uVar20;
      auVar25._10_6_ = auVar26._10_6_;
      auVar25._8_2_ = uVar20;
      auVar25._0_8_ = uVar8;
      uVar20 = (undefined2)uVar9;
      auVar10._4_8_ = auVar25._8_8_;
      auVar10._2_2_ = uVar20;
      auVar10._0_2_ = uVar20;
      uVar3 = *(undefined4 *)(local_48 + lVar12);
      uVar19 = (undefined1)((uint)uVar3 >> 0x18);
      uVar20 = CONCAT11(uVar19,uVar19);
      uVar19 = (undefined1)((uint)uVar3 >> 0x10);
      uVar7 = CONCAT35(CONCAT21(uVar20,uVar19),CONCAT14(uVar19,uVar3));
      uVar19 = (undefined1)((uint)uVar3 >> 8);
      uVar9 = CONCAT51(CONCAT41((int)((ulong)uVar7 >> 0x20),uVar19),uVar19);
      sVar13 = CONCAT11((char)uVar3,(char)uVar3);
      uVar8 = CONCAT62(uVar9,sVar13);
      auVar18._8_4_ = 0;
      auVar18._0_8_ = uVar8;
      auVar18._12_2_ = uVar20;
      auVar18._14_2_ = uVar20;
      uVar20 = (undefined2)((ulong)uVar7 >> 0x20);
      auVar17._12_4_ = auVar18._12_4_;
      auVar17._8_2_ = 0;
      auVar17._0_8_ = uVar8;
      auVar17._10_2_ = uVar20;
      auVar16._10_6_ = auVar17._10_6_;
      auVar16._8_2_ = uVar20;
      auVar16._0_8_ = uVar8;
      uVar20 = (undefined2)uVar9;
      auVar11._4_8_ = auVar16._8_8_;
      auVar11._2_2_ = uVar20;
      auVar11._0_2_ = uVar20;
      iVar14 = ((int)sVar13 >> 8) + ((int)sVar24 >> 8) + iVar14;
      iVar21 = (auVar11._0_4_ >> 0x18) + (auVar10._0_4_ >> 0x18) + iVar21;
      iVar22 = (auVar16._8_4_ >> 0x18) + (auVar25._8_4_ >> 0x18) + iVar22;
      iVar23 = (auVar17._12_4_ >> 0x18) + (auVar26._12_4_ >> 0x18) + iVar23;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x10);
    iVar15 = iVar23 + iVar21 + iVar22 + iVar14;
    if (iVar15 != 0) {
      emit_byte(cinfo,0xff);
      emit_byte(cinfo,0xcc);
      uVar4 = iVar15 * 2 + 2;
      emit_byte(cinfo,uVar4 >> 8 & 0xff);
      emit_byte(cinfo,uVar4 & 0xff);
      lVar12 = 0;
      do {
        if (local_38[lVar12] != '\0') {
          emit_byte(cinfo,(uint)lVar12);
          emit_byte(cinfo,(uint)cinfo->arith_dc_U[lVar12] * 0x10 + (uint)cinfo->arith_dc_L[lVar12]);
        }
        if (local_48[lVar12] != '\0') {
          emit_byte(cinfo,(uint)lVar12 | 0x10);
          emit_byte(cinfo,(uint)cinfo->arith_ac_K[lVar12]);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x10);
    }
  }
  if (cinfo->restart_interval != *(uint *)&pjVar5[1].write_file_header) {
    emit_byte(cinfo,0xff);
    emit_byte(cinfo,0xdd);
    emit_byte(cinfo,0);
    emit_byte(cinfo,4);
    uVar4 = cinfo->restart_interval;
    emit_byte(cinfo,uVar4 >> 8 & 0xff);
    emit_byte(cinfo,uVar4 & 0xff);
    *(uint *)&pjVar5[1].write_file_header = cinfo->restart_interval;
  }
  emit_byte(cinfo,0xff);
  emit_byte(cinfo,0xda);
  uVar4 = cinfo->comps_in_scan * 2 + 6;
  emit_byte(cinfo,uVar4 >> 8 & 0xff);
  emit_byte(cinfo,uVar4 & 0xff);
  emit_byte(cinfo,cinfo->comps_in_scan);
  if (0 < cinfo->comps_in_scan) {
    lVar12 = 0;
    do {
      pjVar6 = cinfo->cur_comp_info[lVar12];
      emit_byte(cinfo,pjVar6->component_id);
      iVar15 = 0;
      if ((cinfo->Ss == 0) && (cinfo->Ah == 0)) {
        iVar15 = pjVar6->dc_tbl_no << 4;
      }
      if (cinfo->Se == 0) {
        iVar14 = 0;
      }
      else {
        iVar14 = pjVar6->ac_tbl_no;
      }
      emit_byte(cinfo,iVar14 + iVar15);
      lVar12 = lVar12 + 1;
    } while (lVar12 < cinfo->comps_in_scan);
  }
  emit_byte(cinfo,cinfo->Ss);
  emit_byte(cinfo,cinfo->Se);
  emit_byte(cinfo,cinfo->Ah * 0x10 + cinfo->Al);
  return;
}

Assistant:

METHODDEF(void)
write_scan_header(j_compress_ptr cinfo)
{
  my_marker_ptr marker = (my_marker_ptr)cinfo->marker;
  int i;
  jpeg_component_info *compptr;

  if (cinfo->arith_code) {
    /* Emit arith conditioning info.  We may have some duplication
     * if the file has multiple scans, but it's so small it's hardly
     * worth worrying about.
     */
    emit_dac(cinfo);
  } else {
    /* Emit Huffman tables.
     * Note that emit_dht() suppresses any duplicate tables.
     */
    for (i = 0; i < cinfo->comps_in_scan; i++) {
      compptr = cinfo->cur_comp_info[i];
      /* DC needs no table for refinement scan */
      if (cinfo->Ss == 0 && cinfo->Ah == 0)
        emit_dht(cinfo, compptr->dc_tbl_no, FALSE);
      /* AC needs no table when not present */
      if (cinfo->Se)
        emit_dht(cinfo, compptr->ac_tbl_no, TRUE);
    }
  }

  /* Emit DRI if required --- note that DRI value could change for each scan.
   * We avoid wasting space with unnecessary DRIs, however.
   */
  if (cinfo->restart_interval != marker->last_restart_interval) {
    emit_dri(cinfo);
    marker->last_restart_interval = cinfo->restart_interval;
  }

  emit_sos(cinfo);
}